

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.cpp
# Opt level: O0

VOID RtlMoveMemory(PVOID Destination,VOID *Source,SIZE_T Length)

{
  SIZE_T Length_local;
  VOID *Source_local;
  PVOID Destination_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  memmove(Destination,Source,Length);
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return;
}

Assistant:

VOID
PALAPI
RtlMoveMemory(
          IN PVOID Destination,
          IN CONST VOID *Source,
          IN SIZE_T Length)
{
    PERF_ENTRY(RtlMoveMemory);
    ENTRY("RtlMoveMemory(Destination:%p, Source:%p, Length:%d)\n",
          Destination, Source, Length);

    memmove(Destination, Source, Length);

    LOGEXIT("RtlMoveMemory returning\n");
    PERF_EXIT(RtlMoveMemory);
}